

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVector.cpp
# Opt level: O0

AlphaVector * __thiscall AlphaVector::operator=(AlphaVector *this,AlphaVector *o)

{
  AlphaVector *in_RSI;
  AlphaVector *in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000078;
  vector<double,_std::allocator<double>_> *in_stack_00000080;
  
  if (in_RDI != in_RSI) {
    in_RDI->_m_action = in_RSI->_m_action;
    std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000080,in_stack_00000078);
    in_RDI->_m_betaI = in_RSI->_m_betaI;
  }
  return in_RDI;
}

Assistant:

AlphaVector& AlphaVector::operator= (const AlphaVector& o)
{
    if (this == &o) return *this;   // Gracefully handle self assignment
    // Put the normal assignment duties here...

    this->_m_action=o._m_action;
    this->_m_values=o._m_values;
    this->_m_betaI=o._m_betaI;

    return *this;
}